

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O2

BBox<1> Omega_h::find_bounding_box<1>(Reals *coords)

{
  Alloc *pAVar1;
  ulong uVar2;
  BBox<1> BVar3;
  Write<double> local_30;
  Write<double> local_20;
  
  pAVar1 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  Write<double>::Write(&local_20,&coords->write_);
  Write<double>::Write(&local_30,&local_20);
  BVar3 = transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<1>,Omega_h::BBox<1>,Omega_h::UniteOp<1>>
                    (0x7fefffffffffffff,0xffefffffffffffff,0,uVar2 >> 3 & 0xffffffff,&local_30);
  Write<double>::~Write(&local_30);
  Write<double>::~Write(&local_20);
  return BVar3;
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}